

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

optional<pbrt::LightLiSample> * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (PortalImageInfiniteLight *this,LightSampleContext ctx,Point2f u,SampledWavelengths lambda
          ,bool allowIncompletePDF)

{
  undefined1 auVar1 [16];
  Vector3<float> v;
  Tuple3<pbrt::Vector3,_float> t;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Point2f uv_00;
  Bounds2f b_00;
  Point2f u_00;
  bool bVar7;
  undefined1 uVar8;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar9;
  PortalImageInfiniteLight *this_00;
  byte in_DL;
  optional<pbrt::LightLiSample> *in_RDI;
  float fVar10;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  float fVar15;
  SampledSpectrum SVar16;
  Point3f PVar17;
  Vector3f VVar18;
  Vector3<float> VVar19;
  Tuple3<pbrt::Point3,_float> TVar20;
  Point3f pl;
  SampledSpectrum L;
  Float pdf;
  Vector3f wi;
  Float duv_dw;
  optional<pbrt::Point2<float>_> uv;
  Float mapPDF;
  optional<pbrt::Bounds2<float>_> b;
  LightLiSample *in_stack_fffffffffffffc98;
  Point3<float> *in_stack_fffffffffffffca8;
  undefined4 uVar21;
  float in_stack_fffffffffffffcb4;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  float fVar23;
  float in_stack_fffffffffffffcd0;
  undefined4 uVar24;
  float fVar25;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  char *in_stack_fffffffffffffce8;
  undefined4 uStack_310;
  int in_stack_fffffffffffffcf4;
  char *in_stack_fffffffffffffcf8;
  undefined4 uStack_300;
  LogLevel in_stack_fffffffffffffd04;
  Float *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd40;
  optional<pbrt::LightLiSample> *lambda_00;
  PortalImageInfiniteLight *this_01;
  Tuple2<pbrt::Point2,_float> uv_01;
  Float *in_stack_fffffffffffffdf8;
  WindowedPiecewiseConstant2D *in_stack_fffffffffffffe00;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe08;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  PortalImageInfiniteLight *in_stack_fffffffffffffe48;
  Tuple3<pbrt::Point3,_float> in_stack_fffffffffffffe60;
  float local_9c;
  optional local_80 [12];
  float local_74;
  undefined4 local_70;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  optional local_30 [23];
  byte local_19;
  undefined8 local_10;
  undefined1 auVar11 [64];
  
  auVar14 = in_ZMM0._8_56_;
  this_01 = (PortalImageInfiniteLight *)&stack0x00000038;
  uv_01 = (Tuple2<pbrt::Point2,_float>)&stack0x00000008;
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_19 = in_DL & 1;
  lambda_00 = in_RDI;
  PVar17 = LightSampleContext::p
                     ((LightSampleContext *)
                      CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  local_58 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  local_60 = vmovlpd_avx(auVar11._0_16_);
  local_50 = local_60;
  local_48 = local_58;
  local_40 = local_60;
  local_38 = local_58;
  ImageBounds(in_stack_fffffffffffffe48,(Point3f)in_stack_fffffffffffffe60);
  bVar7 = pstd::optional::operator_cast_to_bool(local_30);
  if (bVar7) {
    pstd::optional<pbrt::Bounds2<float>_>::operator*((optional<pbrt::Bounds2<float>_> *)0x8caaa3);
    u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe1c;
    u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe18;
    b_00.pMax.super_Tuple2<pbrt::Point2,_float> = in_stack_fffffffffffffe10;
    b_00.pMin.super_Tuple2<pbrt::Point2,_float> = in_stack_fffffffffffffe08;
    WindowedPiecewiseConstant2D::Sample
              (in_stack_fffffffffffffe00,u_00,b_00,in_stack_fffffffffffffdf8);
    uVar8 = pstd::optional::operator_cast_to_bool(local_80);
    if ((bool)uVar8) {
      this_00 = (PortalImageInfiniteLight *)
                pstd::optional<pbrt::Point2<float>_>::operator*
                          ((optional<pbrt::Point2<float>_> *)0x8cab83);
      uVar12 = 0;
      uv_00.super_Tuple2<pbrt::Point2,_float>.y._3_1_ = uVar8;
      uv_00.super_Tuple2<pbrt::Point2,_float>._0_7_ = in_stack_fffffffffffffd40;
      VVar18 = RenderFromImage(this_00,uv_00,in_stack_fffffffffffffd30);
      auVar6._8_8_ = uVar12;
      auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar6);
      if ((local_9c != 0.0) || (NAN(local_9c))) {
        uVar12 = 0;
        fVar10 = local_74 / local_9c;
        eVar9 = IsInf<float>(0.0);
        if (eVar9) {
          LogFatal<char_const(&)[12]>
                    (in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                     in_stack_fffffffffffffce8,
                     (char (*) [12])CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        }
        pstd::optional<pbrt::Point2<float>_>::operator*((optional<pbrt::Point2<float>_> *)0x8cacd0);
        uVar13 = 0;
        SVar16 = ImageLookup(this_01,(Point2f)uv_01,(SampledWavelengths *)lambda_00);
        uStack_300 = (undefined4)uVar12;
        auVar4._8_4_ = uStack_300;
        auVar4._0_8_ = SVar16.values.values._8_8_;
        auVar4._12_4_ = (int)((ulong)uVar12 >> 0x20);
        uVar12 = auVar4._8_8_;
        auVar5._8_8_ = uVar13;
        auVar5._0_8_ = SVar16.values.values._0_8_;
        vmovlpd_avx(auVar5);
        vmovlpd_avx(auVar4);
        PVar17 = LightSampleContext::p
                           ((LightSampleContext *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        uStack_310 = (undefined4)uVar12;
        auVar3._8_4_ = uStack_310;
        auVar3._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar3._12_4_ = (int)((ulong)uVar12 >> 0x20);
        vmovlpd_avx(auVar3);
        uVar12 = 0;
        t.y = (float)in_stack_fffffffffffffccc;
        t.x = (float)in_stack_fffffffffffffcc8;
        t.z = in_stack_fffffffffffffcd0;
        VVar19 = pbrt::operator*(in_stack_fffffffffffffcb4,t);
        fVar15 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        fVar23 = VVar19.super_Tuple3<pbrt::Vector3,_float>.y;
        uVar24 = (undefined4)uVar12;
        fVar25 = (float)((ulong)uVar12 >> 0x20);
        auVar2._8_4_ = uVar24;
        auVar2._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar2._12_4_ = fVar25;
        vmovlpd_avx(auVar2);
        uVar12 = 0;
        v.super_Tuple3<pbrt::Vector3,_float>.y = fVar15;
        v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffcc0;
        v.super_Tuple3<pbrt::Vector3,_float>.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.x;
        TVar20 = (Tuple3<pbrt::Point3,_float>)Point3<float>::operator+(in_stack_fffffffffffffca8,v);
        uVar21 = (undefined4)uVar12;
        uVar22 = (undefined4)((ulong)uVar12 >> 0x20);
        auVar1._8_4_ = uVar21;
        auVar1._0_8_ = TVar20._0_8_;
        auVar1._12_4_ = uVar22;
        vmovlpd_avx(auVar1);
        PVar17.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcc0;
        PVar17.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcbc;
        PVar17.super_Tuple3<pbrt::Point3,_float>.z = fVar15;
        Interaction::Interaction
                  ((Interaction *)CONCAT44(TVar20.z,fVar10),PVar17,
                   (MediumInterface *)in_stack_fffffffffffffc98);
        VVar18.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar24;
        VVar18.super_Tuple3<pbrt::Vector3,_float>.x = fVar23;
        VVar18.super_Tuple3<pbrt::Vector3,_float>.z = fVar25;
        LightLiSample::LightLiSample
                  ((LightLiSample *)CONCAT44(uVar22,uVar21),TVar20._0_8_,VVar18,TVar20.z,
                   (Interaction *)in_stack_fffffffffffffc98);
        pstd::optional<pbrt::LightLiSample>::optional
                  ((optional<pbrt::LightLiSample> *)CONCAT44(TVar20.z,fVar10),
                   in_stack_fffffffffffffc98);
      }
      else {
        memset(in_RDI,0,0x78);
        pstd::optional<pbrt::LightLiSample>::optional(in_RDI);
      }
    }
    else {
      memset(in_RDI,0,0x78);
      pstd::optional<pbrt::LightLiSample>::optional(in_RDI);
    }
    local_70 = 1;
    pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)0x8cafe3);
  }
  else {
    memset(in_RDI,0,0x78);
    pstd::optional<pbrt::LightLiSample>::optional(in_RDI);
    local_70 = 1;
  }
  pstd::optional<pbrt::Bounds2<float>_>::~optional((optional<pbrt::Bounds2<float>_> *)0x8caff0);
  return lambda_00;
}

Assistant:

PBRT_CPU_GPU pstd::optional<LightLiSample> PortalImageInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    bool allowIncompletePDF) const {
    // Sample $(u,v)$ in potentially visible region of light image
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return {};
    Float mapPDF;
    pstd::optional<Point2f> uv = distribution.Sample(u, *b, &mapPDF);
    if (!uv)
        return {};

    // Convert portal image sample point to direction and compute PDF
    Float duv_dw;
    Vector3f wi = RenderFromImage(*uv, &duv_dw);
    if (duv_dw == 0)
        return {};
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    // Compute radiance for portal light sample and return _LightLiSample_
    SampledSpectrum L = ImageLookup(*uv, lambda);
    Point3f pl = ctx.p() + 2 * sceneRadius * wi;
    return LightLiSample(L, wi, pdf, Interaction(pl, &mediumInterface));
}